

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

void __thiscall
helics::CommonCore::generateMessages
          (CommonCore *this,ActionMessage *message,
          vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          *targets)

{
  pointer ppVar1;
  string_view str;
  string_view str_00;
  InterfaceHandle IVar2;
  int iVar3;
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *this_00;
  pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_> *target;
  pointer ppVar4;
  ActionMessage local_1a0;
  ActionMessage local_e8;
  
  *(byte *)&message->flags = (byte)message->flags | 0x80;
  ppVar4 = (targets->
           super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(targets->
            super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4 == 0x18) {
    IVar2.hid = (ppVar4->first).handle.hid;
    message->dest_id = (GlobalFederateId)(ppVar4->first).fed_id.gid;
    message->dest_handle = (InterfaceHandle)IVar2.hid;
    str._M_len = (ppVar4->second)._M_len;
    str._M_str = (ppVar4->second)._M_str;
    ActionMessage::setString(message,0,str);
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    push<helics::ActionMessage>(&(this->super_BrokerBase).actionQueue,message);
    return;
  }
  ActionMessage::ActionMessage(&local_1a0,cmd_multi_message);
  local_1a0.source_id.gid = (message->source_id).gid;
  local_1a0.source_handle.hid = (message->source_handle).hid;
  ppVar1 = (targets->
           super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &(this->super_BrokerBase).actionQueue;
  for (ppVar4 = (targets->
                super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    IVar2.hid = (ppVar4->first).handle.hid;
    message->dest_id = (GlobalFederateId)(ppVar4->first).fed_id.gid;
    message->dest_handle = (InterfaceHandle)IVar2.hid;
    str_00._M_len = (ppVar4->second)._M_len;
    str_00._M_str = (ppVar4->second)._M_str;
    ActionMessage::setString(message,0,str_00);
    iVar3 = appendMessage(&local_1a0,message);
    if (iVar3 < 0) {
      gmlc::containers::
      BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
      push<helics::ActionMessage>(this_00,&local_1a0);
      ActionMessage::ActionMessage(&local_e8,cmd_multi_message);
      ActionMessage::operator=(&local_1a0,&local_e8);
      ActionMessage::~ActionMessage(&local_e8);
      local_1a0.source_id.gid = (message->source_id).gid;
      local_1a0.source_handle.hid = (message->source_handle).hid;
      appendMessage(&local_1a0,message);
    }
  }
  gmlc::containers::
  BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
  push<helics::ActionMessage>(this_00,&local_1a0);
  ActionMessage::~ActionMessage(&local_1a0);
  return;
}

Assistant:

void CommonCore::generateMessages(
    ActionMessage& message,
    const std::vector<std::pair<GlobalHandle, std::string_view>>& targets)
{
    setActionFlag(message, filter_processing_required_flag);
    if (targets.size() == 1) {
        message.setDestination(targets.front().first);
        message.setString(0, targets.front().second);
        actionQueue.push(std::move(message));
        return;
    }
    /** now generate a multimessage*/
    ActionMessage package(CMD_MULTI_MESSAGE);
    package.source_id = message.source_id;
    package.source_handle = message.source_handle;

    for (const auto& target : targets) {
        message.setDestination(target.first);
        message.setString(0, target.second);
        auto res = appendMessage(package, message);
        if (res < 0)  // deal with max package size if there are a lot of subscribers
        {
            actionQueue.push(std::move(package));
            package = ActionMessage(CMD_MULTI_MESSAGE);
            package.source_id = message.source_id;
            package.source_handle = message.source_handle;
            appendMessage(package, message);
        }
    }
    actionQueue.push(std::move(package));
}